

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O2

int __thiscall
CNet::GetWireInBBox(CNet *this,vector<CWire_*,_std::allocator<CWire_*>_> *pWireList,CBBox *pBBox,
                   int iMode,int iValue)

{
  uint uVar1;
  pointer ppCVar2;
  int iVar3;
  int iVar4;
  pointer ppCVar5;
  CWire *pWire;
  CWire *local_40;
  vector<CWire_*,_std::allocator<CWire_*>_> *local_38;
  
  ppCVar5 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar2 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  iVar4 = 0;
  local_38 = pWireList;
  do {
    if (ppCVar5 == ppCVar2) {
      return iVar4;
    }
    local_40 = *ppCVar5;
    if (local_40 == (CWire *)0x0) {
      __assert_fail("pWire",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                    ,0x2e8,"int CNet::GetWireInBBox(vector<CWire *> *, CBBox *, int, int)");
    }
    if ((local_40->super_CObject).m_pParent == (CObject *)0x0) {
      __assert_fail("pWire->GetParent()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                    ,0x2e9,"int CNet::GetWireInBBox(vector<CWire *> *, CBBox *, int, int)");
    }
    if (iMode == 0) {
      uVar1 = (local_40->super_CObject).m_iProp;
joined_r0x0011846b:
      if ((uVar1 & iValue) != 0) {
LAB_0011846d:
        iVar3 = CBBox::IsInside(pBBox,local_40->m_pPointS);
        if (((iVar3 != 0) && (iVar3 = CBBox::IsInside(pBBox,local_40->m_pPointE), iVar3 != 0)) &&
           (iVar4 = iVar4 + 1, local_38 != (vector<CWire_*,_std::allocator<CWire_*>_> *)0x0)) {
          std::vector<CWire_*,_std::allocator<CWire_*>_>::push_back(local_38,&local_40);
        }
      }
    }
    else {
      if (iMode != 0x8000) {
        if (iMode != 1) {
          __assert_fail("FALSE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                        ,0x2f8,"int CNet::GetWireInBBox(vector<CWire *> *, CBBox *, int, int)");
        }
        uVar1 = (local_40->super_CObject).m_iState;
        goto joined_r0x0011846b;
      }
      iVar3 = CWire::GetLength(local_40);
      if (iValue <= iVar3) goto LAB_0011846d;
    }
    ppCVar5 = ppCVar5 + 1;
  } while( true );
}

Assistant:

int CNet::GetWireInBBox(vector<CWire*>* pWireList, CBBox* pBBox, int iMode, int iValue)
{
	int	iNumWire	=	0;
	for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
	{
		CWire*	pWire	=	*itr;

		assert(pWire);
		assert(pWire->GetParent());

		int		iContinue	=	TRUE;

		switch(iMode){
		case GET_MODE_STATE:
			if(pWire->GetState()&iValue)	iContinue	=	FALSE;
			break;
		case GET_MODE_PROP:
			if(pWire->GetProp()&iValue)		iContinue	=	FALSE;
		    break;
		case GET_MODE_LENGTH:
			if(pWire->GetLength()>=iValue)	iContinue	=	FALSE;
			break;
		default:
			assert(FALSE);
		    break;
		}
		
		if(iContinue)	continue;

		if(pBBox->IsInside(pWire->m_pPointS)&&pBBox->IsInside(pWire->m_pPointE))
		{
			++iNumWire;
			if(pWireList)	pWireList->push_back(pWire);
		}
	}

	return	iNumWire;
}